

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_extension.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ExtensionGenerator::GenerateNonNestedInitializationCode
          (ExtensionGenerator *this,Printer *printer)

{
  Printer *this_00;
  bool bVar1;
  Descriptor *pDVar2;
  FileDescriptor *descriptor;
  char *pcVar3;
  int __c;
  int i;
  FieldDescriptor *field;
  java *this_01;
  string local_58;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  ExtensionGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  pDVar2 = FieldDescriptor::extension_scope(this->descriptor_);
  if (pDVar2 == (Descriptor *)0x0) {
    descriptor = FieldDescriptor::file(this->descriptor_);
    bVar1 = HasDescriptorMethods(descriptor);
    this_00 = local_18;
    if (bVar1) {
      this_01 = (java *)this->descriptor_;
      UnderscoresToCamelCase_abi_cxx11_(&local_38,this_01,field);
      pcVar3 = FieldDescriptor::index(this->descriptor_,(char *)this_01,__c);
      SimpleItoa_abi_cxx11_(&local_58,(protobuf *)((ulong)pcVar3 & 0xffffffff),i);
      io::Printer::Print(this_00,"$name$.internalInit(descriptor.getExtensions().get($index$));\n",
                         "name",&local_38,"index",&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_38);
    }
  }
  return;
}

Assistant:

void ExtensionGenerator::GenerateNonNestedInitializationCode(
    io::Printer* printer) {
  if (descriptor_->extension_scope() == NULL &&
      HasDescriptorMethods(descriptor_->file())) {
    // Only applies to non-nested, non-lite extensions.
    printer->Print(
        "$name$.internalInit(descriptor.getExtensions().get($index$));\n",
        "name", UnderscoresToCamelCase(descriptor_),
        "index", SimpleItoa(descriptor_->index()));
  }
}